

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_ToHexString_Test::Body
          (iu_UnitStringTest_x_iutest_x_ToHexString_Test *this)

{
  char cVar1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  byte bVar4;
  long lVar5;
  char cVar6;
  char *__s;
  byte *__s_00;
  AssertionResult iutest_ar;
  string r;
  type **in_stack_fffffffffffffc88;
  AssertionResult local_370;
  AssertionHelper local_348;
  undefined1 local_318 [400];
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178;
  undefined7 uStack_177;
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  string local_48;
  
  local_318._2_6_ = SUB86(local_318._0_8_,2) & 0xffffffffff00;
  local_318._0_2_ = 0x3030;
  local_88[0] = local_78;
  sVar3 = strlen(local_318);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,local_318,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"00\"","::iutest::detail::ToHexString< ::iutest::UInt8 >(0)",
             "00",(char *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xc6;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  local_318._4_4_ = SUB84(local_318._0_8_,4) & 0xffffff00;
  local_318._0_4_ = 0x30303030;
  local_a8[0] = local_98;
  sVar3 = strlen(local_318);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_318,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"0000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt16 >(0)","0000",(char *)local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 199;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_318._0_8_ = 0x3030303030303030;
  local_c8[0] = local_b8;
  sVar3 = strlen(local_318);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,local_318,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"00000000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt32 >(0)","00000000",(char *)local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 200;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  local_318[0x10] = 0;
  local_318[0] = '0';
  local_318[1] = '0';
  local_318[2] = '0';
  local_318[3] = '0';
  local_318[4] = '0';
  local_318[5] = '0';
  local_318[6] = '0';
  local_318[7] = '0';
  local_318[8] = '0';
  local_318[9] = '0';
  local_318[10] = '0';
  local_318[0xb] = '0';
  local_318[0xc] = '0';
  local_318[0xd] = '0';
  local_318[0xe] = '0';
  local_318[0xf] = '0';
  local_e8[0] = local_d8;
  sVar3 = strlen(local_318);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,local_318,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"0000000000000000\"",
             "::iutest::detail::ToHexString< ::iutest::UInt64 >(0)","0000000000000000",
             (char *)local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xc9;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  __s = local_318;
  local_318[0x10] = 0;
  local_318[0] = 'F';
  local_318[1] = 'F';
  local_318[2] = 'F';
  local_318[3] = 'F';
  local_318[4] = 'F';
  local_318[5] = 'F';
  local_318[6] = 'F';
  local_318[7] = 'F';
  local_318[8] = 'F';
  local_318[9] = 'F';
  local_318[10] = 'F';
  local_318[0xb] = 'F';
  local_318[0xc] = 'F';
  local_318[0xd] = 'F';
  local_318[0xe] = 'F';
  local_318[0xf] = 'F';
  local_108[0] = local_f8;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,__s,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"FFFFFFFFFFFFFFFF\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >(-1)","FFFFFFFFFFFFFFFF",
             (char *)local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xca;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  local_318._0_8_ = 0;
  local_318._8_8_ = 0;
  lVar5 = 0x3c;
  do {
    uVar2 = (uint)(0x7fffffffffffffff >> ((byte)lVar5 & 0x3f)) & 0xf;
    cVar1 = (char)uVar2;
    cVar6 = cVar1 + '0';
    if (9 < uVar2) {
      cVar6 = cVar1 + '7';
    }
    *__s = cVar6;
    lVar5 = lVar5 + -4;
    __s = __s + 1;
  } while (lVar5 != -4);
  __s_00 = local_318;
  local_318[0x10] = 0;
  local_128[0] = local_118;
  sVar3 = strlen((char *)__s_00);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,__s_00,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"7FFFFFFFFFFFFFFF\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >((9223372036854775807L))",
             "7FFFFFFFFFFFFFFF",(char *)local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xcc;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  local_318._0_8_ = 0;
  local_318._8_8_ = 0;
  lVar5 = 0x3c;
  do {
    *__s_00 = (byte)(-0x8000000000000000 >> ((byte)lVar5 & 0x3f)) & 8 | 0x30;
    lVar5 = lVar5 + -4;
    __s_00 = __s_00 + 1;
  } while (lVar5 != -4);
  local_318[0x10] = 0;
  local_148[0] = local_138;
  sVar3 = strlen(local_318);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,local_318,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"8000000000000000\"",
             "::iutest::detail::ToHexString< ::iutest::Int64 >((-9223372036854775807L-1))",
             "8000000000000000",(char *)local_148,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xcd;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  local_318._0_8_ = 0;
  bVar4 = 0x1c;
  lVar5 = 0;
  do {
    local_318[lVar5] = (byte)(0x1234567 >> (bVar4 & 0x1f)) & 7 | 0x30;
    lVar5 = lVar5 + 1;
    bVar4 = bVar4 - 4;
  } while (lVar5 != 8);
  local_318._8_8_ = local_318._8_8_ & 0xffffffffffffff00;
  local_168[0] = local_158;
  sVar3 = strlen(local_318);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,local_318,local_318 + sVar3);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"01234567\"","::iutest::detail::ToHexString(0x01234567u)",
             "01234567",(char *)local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xcf;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::ToHexString<char>(&local_48,"ABC",-1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"414243\"","::iutest::detail::ToHexString(\"ABC\", -1)",
             "414243",(char *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xd0;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::ToHexString<char>(&local_68,"ABC",2);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"4142\"","::iutest::detail::ToHexString(\"ABC\", 2)","4142",
             (char *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xd1;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  local_180 = 0;
  local_178 = 0;
  local_188 = &local_178;
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_370,(internal *)"\"\"","::iutest::detail::ToHexString(\"ABC\", 0)","",
             (char *)&local_188,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc88);
  if (local_188 != &local_178) {
    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
  }
  if (local_370.m_result == false) {
    memset((iu_global_format_stringstream *)local_318,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,local_370.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc8f);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xd2;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_318,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_message._M_dataplus._M_p != &local_370.m_message.field_2) {
    operator_delete(local_370.m_message._M_dataplus._M_p,
                    local_370.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, ToHexString)
{
    IUTEST_EXPECT_STREQ(              "00", ::iutest::detail::ToHexString< ::iutest::UInt8  >(0));
    IUTEST_EXPECT_STREQ(            "0000", ::iutest::detail::ToHexString< ::iutest::UInt16 >(0));
    IUTEST_EXPECT_STREQ(        "00000000", ::iutest::detail::ToHexString< ::iutest::UInt32 >(0));
    IUTEST_EXPECT_STREQ("0000000000000000", ::iutest::detail::ToHexString< ::iutest::UInt64 >(0));
    IUTEST_EXPECT_STREQ("FFFFFFFFFFFFFFFF", ::iutest::detail::ToHexString< ::iutest::Int64 >(-1));
#if defined(INT64_MAX)
    IUTEST_EXPECT_STREQ("7FFFFFFFFFFFFFFF", ::iutest::detail::ToHexString< ::iutest::Int64 >(INT64_MAX));
    IUTEST_EXPECT_STREQ("8000000000000000", ::iutest::detail::ToHexString< ::iutest::Int64 >(INT64_MIN));
#endif
    IUTEST_EXPECT_STREQ(        "01234567", ::iutest::detail::ToHexString(0x01234567u));
    IUTEST_EXPECT_STREQ(          "414243", ::iutest::detail::ToHexString("ABC", -1));
    IUTEST_EXPECT_STREQ(            "4142", ::iutest::detail::ToHexString("ABC", 2));
    IUTEST_EXPECT_STREQ(                "", ::iutest::detail::ToHexString("ABC", 0));
}